

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O2

Result __thiscall
wabt::interp::anon_unknown_1::BinaryReaderInterp::OnImportMemory
          (BinaryReaderInterp *this,Index import_index,string_view module_name,
          string_view field_name,Index memory_index,Limits *page_limits,uint32_t page_size)

{
  ModuleDesc *pMVar1;
  Result RVar2;
  Enum EVar3;
  allocator<char> local_112;
  allocator<char> local_111;
  undefined1 local_110 [8];
  value_type local_108;
  string_view field_name_local;
  string_view module_name_local;
  string local_b8;
  string local_98;
  Location loc;
  
  field_name_local._M_str = field_name._M_str;
  field_name_local._M_len = field_name._M_len;
  module_name_local._M_str = module_name._M_str;
  module_name_local._M_len = module_name._M_len;
  loc.field_1.field_0.last_column = 0;
  loc.filename._M_len = (this->filename_)._M_len;
  loc.filename._M_str = (this->filename_)._M_str;
  loc.field_1.field_1.offset =
       (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
       ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
  RVar2 = SharedValidator::OnMemory(&this->validator_,&loc,page_limits,page_size);
  if (RVar2.enum_ == Error) {
    EVar3 = Error;
  }
  else {
    local_108.limits.initial = page_limits->initial;
    local_108.limits.max = page_limits->max;
    local_108.limits.has_max = page_limits->has_max;
    local_108.limits.is_shared = page_limits->is_shared;
    local_108.limits.is_64 = page_limits->is_64;
    local_108.limits._23_1_ = page_limits->field_0x17;
    local_108.limits._19_4_ = *(undefined4 *)&page_limits->field_0x13;
    local_108.super_ExternType.kind = Memory;
    local_108.super_ExternType._vptr_ExternType = (_func_int **)&PTR__ExternType_0024e900;
    local_108.page_size = page_size;
    if ((local_108.limits.has_max & 1U) == 0) {
      local_108.limits.max =
           WABT_BYTES_TO_MIN_PAGES(-(ulong)(local_108.limits.is_64 & 1) | 0xffffffff,page_size);
    }
    pMVar1 = this->module_;
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((string *)&local_98,&module_name_local,&local_111);
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((string *)&local_b8,&field_name_local,&local_112);
    MemoryType::Clone((MemoryType *)local_110);
    ImportType::ImportType
              ((ImportType *)&loc,&local_98,&local_b8,
               (unique_ptr<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>
                *)local_110);
    std::vector<wabt::interp::ImportDesc,_std::allocator<wabt::interp::ImportDesc>_>::
    emplace_back<wabt::interp::ImportDesc>(&pMVar1->imports,(ImportDesc *)&loc);
    ImportType::~ImportType((ImportType *)&loc);
    if (local_110 != (undefined1  [8])0x0) {
      (**(code **)(*(_func_int **)local_110 + 8))();
    }
    local_110 = (undefined1  [8])0x0;
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
    std::vector<wabt::interp::MemoryType,_std::allocator<wabt::interp::MemoryType>_>::push_back
              (&this->memory_types_,&local_108);
    EVar3 = Ok;
  }
  return (Result)EVar3;
}

Assistant:

Result BinaryReaderInterp::OnImportMemory(Index import_index,
                                          std::string_view module_name,
                                          std::string_view field_name,
                                          Index memory_index,
                                          const Limits* page_limits,
                                          uint32_t page_size) {
  CHECK_RESULT(validator_.OnMemory(GetLocation(), *page_limits, page_size));
  MemoryType memory_type{*page_limits, page_size};
  module_.imports.push_back(ImportDesc{ImportType(
      std::string(module_name), std::string(field_name), memory_type.Clone())});
  memory_types_.push_back(memory_type);
  return Result::Ok;
}